

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,void **our_elems,void **other_elems,int length,
          int already_allocated)

{
  EnumDescriptorProto *pEVar1;
  Arena *arena_00;
  EnumDescriptorProto *pEVar2;
  Type *new_elem_1;
  Type *other_elem;
  int i_1;
  Type *new_elem;
  int i;
  Type *elem_prototype;
  Arena *arena;
  int already_allocated_local;
  int length_local;
  void **other_elems_local;
  void **our_elems_local;
  RepeatedPtrFieldBase *this_local;
  
  if (already_allocated < length) {
    arena_00 = GetArena(this);
    pEVar1 = (EnumDescriptorProto *)*other_elems;
    for (new_elem._4_4_ = already_allocated; new_elem._4_4_ < length;
        new_elem._4_4_ = new_elem._4_4_ + 1) {
      pEVar2 = GenericTypeHandler<google::protobuf::EnumDescriptorProto>::NewFromPrototype
                         (pEVar1,arena_00);
      our_elems[new_elem._4_4_] = pEVar2;
    }
  }
  for (other_elem._4_4_ = 0; other_elem._4_4_ < length; other_elem._4_4_ = other_elem._4_4_ + 1) {
    GenericTypeHandler<google::protobuf::EnumDescriptorProto>::Merge
              ((EnumDescriptorProto *)other_elems[other_elem._4_4_],
               (EnumDescriptorProto *)our_elems[other_elem._4_4_]);
  }
  return;
}

Assistant:

void RepeatedPtrFieldBase::MergeFromInnerLoop(void** our_elems,
                                              void** other_elems, int length,
                                              int already_allocated) {
  if (already_allocated < length) {
    Arena* arena = GetArena();
    typename TypeHandler::Type* elem_prototype =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[0]);
    for (int i = already_allocated; i < length; i++) {
      // Allocate a new empty element that we'll merge into below
      typename TypeHandler::Type* new_elem =
          TypeHandler::NewFromPrototype(elem_prototype, arena);
      our_elems[i] = new_elem;
    }
  }
  // Main loop that does the actual merging
  for (int i = 0; i < length; i++) {
    // Already allocated: use existing element.
    typename TypeHandler::Type* other_elem =
        reinterpret_cast<typename TypeHandler::Type*>(other_elems[i]);
    typename TypeHandler::Type* new_elem =
        reinterpret_cast<typename TypeHandler::Type*>(our_elems[i]);
    TypeHandler::Merge(*other_elem, new_elem);
  }
}